

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int stats_mutexes_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  mutex_prof_data_t *data;
  malloc_mutex_t *mutex;
  
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  malloc_mutex_prof_data_reset((tsdn_t *)tsd,&ctl_mtx);
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&background_thread_lock);
    background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(background_thread_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)(background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    background_thread_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  malloc_mutex_prof_data_reset((tsdn_t *)tsd,&background_thread_lock);
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  uVar4 = narenas_total_get();
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pvVar8 = arenas[uVar5].repr;
      if (pvVar8 == (void *)0x0) {
        pvVar8 = (void *)0x0;
      }
      if (pvVar8 != (void *)0x0) {
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x28b8));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x2878));
          *(undefined1 *)((long)pvVar8 + 0x28e0) = 1;
        }
        *(long *)((long)pvVar8 + 0x28b0) = *(long *)((long)pvVar8 + 0x28b0) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x28a8) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x28a8) = tsd;
          *(long *)((long)pvVar8 + 0x28a0) = *(long *)((long)pvVar8 + 0x28a0) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x2878));
        *(undefined1 *)((long)pvVar8 + 0x28e0) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x28b8));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x71d8));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x7198));
          *(undefined1 *)((long)pvVar8 + 0x7200) = 1;
        }
        *(long *)((long)pvVar8 + 0x71d0) = *(long *)((long)pvVar8 + 0x71d0) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x71c8) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x71c8) = tsd;
          *(long *)((long)pvVar8 + 0x71c0) = *(long *)((long)pvVar8 + 0x71c0) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x7198));
        *(undefined1 *)((long)pvVar8 + 0x7200) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x71d8));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x2928));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x28e8));
          *(undefined1 *)((long)pvVar8 + 0x2950) = 1;
        }
        *(long *)((long)pvVar8 + 0x2920) = *(long *)((long)pvVar8 + 0x2920) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x2918) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x2918) = tsd;
          *(long *)((long)pvVar8 + 0x2910) = *(long *)((long)pvVar8 + 0x2910) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x28e8));
        *(undefined1 *)((long)pvVar8 + 0x2950) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x2928));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x3c90));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x3c50));
          *(undefined1 *)((long)pvVar8 + 0x3cb8) = 1;
        }
        *(long *)((long)pvVar8 + 0x3c88) = *(long *)((long)pvVar8 + 0x3c88) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x3c80) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x3c80) = tsd;
          *(long *)((long)pvVar8 + 0x3c78) = *(long *)((long)pvVar8 + 0x3c78) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x3c50));
        *(undefined1 *)((long)pvVar8 + 0x3cb8) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x3c90));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x4ff8));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x4fb8));
          *(undefined1 *)((long)pvVar8 + 0x5020) = 1;
        }
        *(long *)((long)pvVar8 + 0x4ff0) = *(long *)((long)pvVar8 + 0x4ff0) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x4fe8) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x4fe8) = tsd;
          *(long *)((long)pvVar8 + 0x4fe0) = *(long *)((long)pvVar8 + 0x4fe0) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x4fb8));
        *(undefined1 *)((long)pvVar8 + 0x5020) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x4ff8));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x6360));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x6320));
          *(undefined1 *)((long)pvVar8 + 0x6388) = 1;
        }
        *(long *)((long)pvVar8 + 0x6358) = *(long *)((long)pvVar8 + 0x6358) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x6350) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x6350) = tsd;
          *(long *)((long)pvVar8 + 0x6348) = *(long *)((long)pvVar8 + 0x6348) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x6320));
        *(undefined1 *)((long)pvVar8 + 0x6388) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x6360));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x6a58));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x6a18));
          *(undefined1 *)((long)pvVar8 + 0x6a80) = 1;
        }
        *(long *)((long)pvVar8 + 0x6a50) = *(long *)((long)pvVar8 + 0x6a50) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x6a48) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x6a48) = tsd;
          *(long *)((long)pvVar8 + 0x6a40) = *(long *)((long)pvVar8 + 0x6a40) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x6a18));
        *(undefined1 *)((long)pvVar8 + 0x6a80) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x6a58));
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar8 + 0x2810));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar8 + 0x27d0));
          *(undefined1 *)((long)pvVar8 + 0x2838) = 1;
        }
        *(long *)((long)pvVar8 + 0x2808) = *(long *)((long)pvVar8 + 0x2808) + 1;
        if (*(tsd_t **)((long)pvVar8 + 0x2800) != tsd) {
          *(tsd_t **)((long)pvVar8 + 0x2800) = tsd;
          *(long *)((long)pvVar8 + 0x27f8) = *(long *)((long)pvVar8 + 0x27f8) + 1;
        }
        malloc_mutex_prof_data_reset((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar8 + 0x27d0));
        *(undefined1 *)((long)pvVar8 + 0x2838) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar8 + 0x2810));
        lVar6 = *(long *)((long)pvVar8 + 0x7328);
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)(lVar6 + 0x50));
        if (iVar3 != 0) {
          malloc_mutex_lock_slow((malloc_mutex_t *)(lVar6 + 0x10));
          *(undefined1 *)(lVar6 + 0x78) = 1;
        }
        *(long *)(lVar6 + 0x48) = *(long *)(lVar6 + 0x48) + 1;
        if (*(tsd_t **)(lVar6 + 0x40) != tsd) {
          *(tsd_t **)(lVar6 + 0x40) = tsd;
          *(long *)(lVar6 + 0x38) = *(long *)(lVar6 + 0x38) + 1;
        }
        malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar8 + 0x7328) + 0x10));
        lVar6 = *(long *)((long)pvVar8 + 0x7328);
        *(undefined1 *)(lVar6 + 0x78) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)(lVar6 + 0x50));
        lVar6 = 0;
        do {
          if (bin_infos[lVar6].n_shards != 0) {
            lVar9 = 0x40;
            uVar7 = 0;
            do {
              lVar2 = *(long *)((long)pvVar8 + lVar6 * 8 + 0x7208);
              mutex = (malloc_mutex_t *)(lVar9 + lVar2 + -0x40);
              iVar3 = pthread_mutex_trylock((pthread_mutex_t *)(lVar9 + lVar2));
              if (iVar3 != 0) {
                malloc_mutex_lock_slow(mutex);
                *(undefined1 *)(lVar2 + 0x28 + lVar9) = 1;
              }
              plVar1 = (long *)(lVar2 + -8 + lVar9);
              *plVar1 = *plVar1 + 1;
              if (*(tsd_t **)(lVar2 + -0x10 + lVar9) != tsd) {
                *(tsd_t **)(lVar2 + -0x10 + lVar9) = tsd;
                plVar1 = (long *)(lVar2 + -0x18 + lVar9);
                *plVar1 = *plVar1 + 1;
              }
              malloc_mutex_prof_data_reset((tsdn_t *)tsd,mutex);
              *(undefined1 *)(lVar2 + 0x28 + lVar9) = 0;
              pthread_mutex_unlock((pthread_mutex_t *)(lVar9 + lVar2));
              uVar7 = uVar7 + 1;
              lVar9 = lVar9 + 0x118;
            } while (uVar7 < bin_infos[lVar6].n_shards);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x24);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar4);
  }
  return 0;
}

Assistant:

static int
stats_mutexes_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}

	tsdn_t *tsdn = tsd_tsdn(tsd);

#define MUTEX_PROF_RESET(mtx)						\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_data_reset(tsdn, &mtx);				\
    malloc_mutex_unlock(tsdn, &mtx);

	/* Global mutexes: ctl and prof. */
	MUTEX_PROF_RESET(ctl_mtx);
	if (have_background_thread) {
		MUTEX_PROF_RESET(background_thread_lock);
	}
	if (config_prof && opt_prof) {
		MUTEX_PROF_RESET(bt2gctx_mtx);
	}


	/* Per arena mutexes. */
	unsigned n = narenas_total_get();

	for (unsigned i = 0; i < n; i++) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		MUTEX_PROF_RESET(arena->large_mtx);
		MUTEX_PROF_RESET(arena->extent_avail_mtx);
		MUTEX_PROF_RESET(arena->extents_dirty.mtx);
		MUTEX_PROF_RESET(arena->extents_muzzy.mtx);
		MUTEX_PROF_RESET(arena->extents_retained.mtx);
		MUTEX_PROF_RESET(arena->decay_dirty.mtx);
		MUTEX_PROF_RESET(arena->decay_muzzy.mtx);
		MUTEX_PROF_RESET(arena->tcache_ql_mtx);
		MUTEX_PROF_RESET(arena->base->mtx);

		for (szind_t i = 0; i < SC_NBINS; i++) {
			for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
				bin_t *bin = &arena->bins[i].bin_shards[j];
				MUTEX_PROF_RESET(bin->lock);
			}
		}
	}
#undef MUTEX_PROF_RESET
	return 0;
}